

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::FindNextBlocks
          (PeerManagerImpl *this,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *vBlocks,Peer *peer,
          CNodeState *state,CBlockIndex *pindexWalk,uint count,int nWindowEnd,CChain *activeChain,
          NodeId *nodeStaller)

{
  int iVar1;
  pointer ppCVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  uint uVar7;
  uint256 *__k;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  iterator __begin2;
  pointer ppCVar11;
  long in_FS_OFFSET;
  long local_c0;
  CBlockIndex *pindex;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToFetch;
  _Rb_tree_node_base local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = state->pindexBestKnownBlock->nHeight;
  if (nWindowEnd + 1 < iVar1) {
    iVar1 = nWindowEnd + 1;
  }
  if (((peer->m_their_services)._M_i & NODE_NETWORK) == NODE_NONE) {
    bVar3 = (byte)((peer->m_their_services)._M_i >> 10) & 1;
  }
  else {
    bVar3 = 0;
  }
  local_c0 = -1;
  do {
    iVar5 = iVar1 - pindexWalk->nHeight;
    if (iVar5 == 0 || iVar1 < pindexWalk->nHeight) {
LAB_0074a5bc:
      std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
                (&vToFetch.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    iVar8 = count - (int)((ulong)((long)(vBlocks->
                                        super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(vBlocks->
                                       super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar8 < 0x81) {
      iVar8 = 0x80;
    }
    if (iVar5 <= iVar8) {
      iVar8 = iVar5;
    }
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::resize
              (&vToFetch,(long)iVar8);
    pindexWalk = CBlockIndex::GetAncestor(state->pindexBestKnownBlock,pindexWalk->nHeight + iVar8);
    ppCVar2 = vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start[(long)iVar8 - 1] = pindexWalk;
    __k = (uint256 *)
          vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)(iVar8 - 1);
    while (uVar9 = uVar10 - 1,
          ppCVar11 = vToFetch.
                     super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_start, uVar9 != 0xffffffffffffffff) {
      __k = (uint256 *)(uVar9 & 0xffffffff);
      vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
      .super__Vector_impl_data._M_start[(long)__k] =
           vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar10]->pprev;
      uVar10 = uVar9;
    }
    for (; ppCVar11 != ppCVar2; ppCVar11 = ppCVar11 + 1) {
      pindex = *ppCVar11;
      if ((((pindex->nStatus & 0x60) != 0) || ((pindex->nStatus & 6) == 0)) ||
         ((((peer->m_their_services)._M_i & NODE_WITNESS) == NODE_NONE &&
          (bVar4 = DeploymentActiveAt<Consensus::BuriedDeployment>
                             (pindex,this->m_chainman,DEPLOYMENT_SEGWIT), bVar4))))
      goto LAB_0074a5bc;
      if ((pindex->nStatus & 8) == 0) {
        if ((activeChain == (CChain *)0x0) || (bVar4 = CChain::Contains(activeChain,pindex), !bVar4)
           ) {
          CBlockIndex::GetBlockHash((uint256 *)&local_58,pindex);
          bVar4 = IsBlockRequested(this,(uint256 *)&local_58);
          if (bVar4) {
            if (local_c0 == -1) {
              CBlockIndex::GetBlockHash((uint256 *)&local_58,pindex);
              iVar6 = std::
                      _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                      ::_M_lower_bound((_Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                                        *)(this->mapBlocksInFlight)._M_t._M_impl.
                                          super__Rb_tree_header._M_header._M_parent,
                                       (_Link_type)
                                       &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header
                                       ,&local_58,__k);
              local_c0 = *(long *)(iVar6._M_node + 2);
            }
          }
          else {
            __k = (uint256 *)(ulong)(uint)nWindowEnd;
            if (nWindowEnd < pindex->nHeight) {
              if ((((vBlocks->
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish ==
                    (vBlocks->
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                    _M_impl.super__Vector_impl_data._M_start) && (nodeStaller != (NodeId *)0x0)) &&
                 (local_c0 != peer->m_id)) {
                *nodeStaller = local_c0;
              }
              goto LAB_0074a5bc;
            }
            if (((bVar3 == 0) ||
                (uVar7 = state->pindexBestKnownBlock->nHeight - pindex->nHeight,
                __k = (uint256 *)(ulong)uVar7, (int)uVar7 < 0x11e)) &&
               (std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                          (vBlocks,&pindex),
               (long)(vBlocks->
                     super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(vBlocks->
                     super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)count))
            goto LAB_0074a5bc;
          }
        }
        else {
LAB_0074a50d:
          if (pindex->m_chain_tx_count != 0) {
            state->pindexLastCommonBlock = pindex;
          }
        }
      }
      else if (activeChain != (CChain *)0x0) goto LAB_0074a50d;
    }
  } while( true );
}

Assistant:

void PeerManagerImpl::FindNextBlocks(std::vector<const CBlockIndex*>& vBlocks, const Peer& peer, CNodeState *state, const CBlockIndex *pindexWalk, unsigned int count, int nWindowEnd, const CChain* activeChain, NodeId* nodeStaller)
{
    std::vector<const CBlockIndex*> vToFetch;
    int nMaxHeight = std::min<int>(state->pindexBestKnownBlock->nHeight, nWindowEnd + 1);
    bool is_limited_peer = IsLimitedPeer(peer);
    NodeId waitingfor = -1;
    while (pindexWalk->nHeight < nMaxHeight) {
        // Read up to 128 (or more, if more blocks than that are needed) successors of pindexWalk (towards
        // pindexBestKnownBlock) into vToFetch. We fetch 128, because CBlockIndex::GetAncestor may be as expensive
        // as iterating over ~100 CBlockIndex* entries anyway.
        int nToFetch = std::min(nMaxHeight - pindexWalk->nHeight, std::max<int>(count - vBlocks.size(), 128));
        vToFetch.resize(nToFetch);
        pindexWalk = state->pindexBestKnownBlock->GetAncestor(pindexWalk->nHeight + nToFetch);
        vToFetch[nToFetch - 1] = pindexWalk;
        for (unsigned int i = nToFetch - 1; i > 0; i--) {
            vToFetch[i - 1] = vToFetch[i]->pprev;
        }

        // Iterate over those blocks in vToFetch (in forward direction), adding the ones that
        // are not yet downloaded and not in flight to vBlocks. In the meantime, update
        // pindexLastCommonBlock as long as all ancestors are already downloaded, or if it's
        // already part of our chain (and therefore don't need it even if pruned).
        for (const CBlockIndex* pindex : vToFetch) {
            if (!pindex->IsValid(BLOCK_VALID_TREE)) {
                // We consider the chain that this peer is on invalid.
                return;
            }

            if (!CanServeWitnesses(peer) && DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
                // We wouldn't download this block or its descendants from this peer.
                return;
            }

            if (pindex->nStatus & BLOCK_HAVE_DATA || (activeChain && activeChain->Contains(pindex))) {
                if (activeChain && pindex->HaveNumChainTxs()) {
                    state->pindexLastCommonBlock = pindex;
                }
                continue;
            }

            // Is block in-flight?
            if (IsBlockRequested(pindex->GetBlockHash())) {
                if (waitingfor == -1) {
                    // This is the first already-in-flight block.
                    waitingfor = mapBlocksInFlight.lower_bound(pindex->GetBlockHash())->second.first;
                }
                continue;
            }

            // The block is not already downloaded, and not yet in flight.
            if (pindex->nHeight > nWindowEnd) {
                // We reached the end of the window.
                if (vBlocks.size() == 0 && waitingfor != peer.m_id) {
                    // We aren't able to fetch anything, but we would be if the download window was one larger.
                    if (nodeStaller) *nodeStaller = waitingfor;
                }
                return;
            }

            // Don't request blocks that go further than what limited peers can provide
            if (is_limited_peer && (state->pindexBestKnownBlock->nHeight - pindex->nHeight >= static_cast<int>(NODE_NETWORK_LIMITED_MIN_BLOCKS) - 2 /* two blocks buffer for possible races */)) {
                continue;
            }

            vBlocks.push_back(pindex);
            if (vBlocks.size() == count) {
                return;
            }
        }
    }
}